

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O3

int hydro_hash_update(hydro_hash_state *state,void *in_,size_t in_len)

{
  byte *pbVar1;
  long lVar2;
  uint8_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t *in;
  uint8_t *buf;
  ulong uVar6;
  
  if (in_len != 0) {
    uVar5 = (ulong)state->buf_off;
    do {
      uVar4 = 0x10;
      uVar6 = 0x10 - (uVar5 & 0xff);
      if (in_len < uVar6) {
        uVar6 = in_len;
      }
      if ((char)uVar5 != '\x10') {
        lVar2 = 0;
        do {
          pbVar1 = (byte *)((long)state->state + lVar2 + (ulong)state->buf_off);
          *pbVar1 = *pbVar1 ^ *(byte *)((long)in_ + lVar2);
          lVar2 = lVar2 + 1;
        } while (uVar6 + (uVar6 == 0) != lVar2);
        uVar4 = (uint)state->buf_off;
      }
      uVar4 = (int)uVar6 + uVar4;
      uVar5 = (ulong)uVar4;
      uVar3 = (uint8_t)uVar4;
      state->buf_off = uVar3;
      if (uVar3 == '\x10') {
        uVar5 = 0;
        gimli_core_u8((uint8_t *)state,'\0');
        state->buf_off = '\0';
      }
      in_ = (void *)((long)in_ + uVar6);
      in_len = in_len - uVar6;
    } while (in_len != 0);
  }
  return 0;
}

Assistant:

int
hydro_hash_update(hydro_hash_state *state, const void *in_, size_t in_len)
{
    const uint8_t *in  = (const uint8_t *) in_;
    uint8_t       *buf = (uint8_t *) (void *) state->state;
    size_t         left;
    size_t         ps;
    size_t         i;

    while (in_len > 0) {
        left = gimli_RATE - state->buf_off;
        if ((ps = in_len) > left) {
            ps = left;
        }
        for (i = 0; i < ps; i++) {
            buf[state->buf_off + i] ^= in[i];
        }
        in += ps;
        in_len -= ps;
        state->buf_off += (uint8_t) ps;
        if (state->buf_off == gimli_RATE) {
            gimli_core_u8(buf, 0);
            state->buf_off = 0;
        }
    }
    return 0;
}